

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O1

void __thiscall ProblemAloha::InitializeAloha(ProblemAloha *this)

{
  MADPComponentFactoredStates *this_00;
  uint uVar1;
  int iVar2;
  pointer ppRVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Index IVar6;
  Index IVar7;
  value_type_conflict1 *__val;
  size_t *psVar8;
  ulong uVar9;
  FSDist_COF *this_01;
  Scope *this_02;
  Scope *this_03;
  size_t sVar10;
  RewardModelMapping *this_04;
  E *this_05;
  char *pcVar11;
  Index bI_1;
  Index newPacket_00;
  Index backlog;
  undefined1 auVar12 [16];
  undefined1 in_XMM2 [16];
  Scope ySc;
  Index bI;
  undefined4 uStack_294;
  pointer puStack_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  Index newPacket;
  undefined4 uStack_274;
  pointer puStack_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined1 local_258 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> yVals;
  double local_228;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrElems;
  vector<unsigned_int,_std::allocator<unsigned_int>_> emptyVec;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream ss;
  undefined4 uStack_1b4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  sVar10 = (size_t)*(uint *)&(this->super_FactoredDecPOMDPDiscrete).field_0x704;
  switch(sVar10) {
  case 0:
  case 2:
    sVar10 = 2;
    break;
  case 1:
    break;
  case 3:
  case 4:
  case 5:
    sVar10 = 3;
    break;
  case 6:
    sVar10 = 5;
    break;
  case 7:
  case 8:
    sVar10 = 4;
    break;
  case 9:
    sVar10 = 6;
    break;
  case 10:
    sVar10 = 7;
    break;
  case 0xb:
    sVar10 = this->_m_nrAgentsPassedOnCommandline;
    break;
  default:
    this_05 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_05,"InitializeAloha() island config not handled");
    __cxa_throw(this_05,&E::typeinfo,E::~E);
  }
  this->_m_nrIslands = sVar10;
  MultiAgentDecisionProcess::SetNrAgents((MultiAgentDecisionProcess *)this,sVar10);
  (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                         super_MultiAgentDecisionProcess + 0x318))(&ss,this);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              _m_name._m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ss != local_1a8) {
    operator_delete(_ss,local_1a8[0]._M_allocated_capacity + 1);
  }
  (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                         super_MultiAgentDecisionProcess + 800))(&ss,this);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              _m_name._m_description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ss != local_1a8) {
    operator_delete(_ss,local_1a8[0]._M_allocated_capacity + 1);
  }
  (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                         super_MultiAgentDecisionProcess + 0x318))(local_1d8,this);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              _m_unixName);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 2;
  *nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0;
  *nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start =
       *(unsigned_long *)&(this->super_FactoredDecPOMDPDiscrete).field_0x710;
  nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  psVar8 = IndexTools::CalculateStepSize(&nrElems);
  this->_m_stepSizeState = psVar8;
  *nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  psVar8 = IndexTools::CalculateStepSize(&nrElems);
  this->_m_stepSizeObservations = psVar8;
  if (this->_m_nrIslands != 0) {
    this_00 = &(this->super_FactoredDecPOMDPDiscrete).
               super_MultiAgentDecisionProcessDiscreteFactoredStates._m_S;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_258._8_8_;
    local_258 = auVar12 << 0x40;
    do {
      ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ySc,"BL","");
      StringTools::Append((string *)&ss,(string *)&ySc,local_258._0_4_);
      _newPacket = (pointer)&local_268;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&newPacket,"The back log of island ","");
      StringTools::Append((string *)&bI,(string *)&newPacket,local_258._0_4_);
      IVar6 = MADPComponentFactoredStates::AddStateFactor(this_00,(string *)&ss,(string *)&bI);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_bI != &local_288) {
        operator_delete(_bI,local_288._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_newPacket != &local_268) {
        operator_delete(_newPacket,local_268._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_ss != local_1a8) {
        operator_delete(_ss,local_1a8[0]._M_allocated_capacity + 1);
      }
      if ((pointer *)
          ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(ySc.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)ySc.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      uVar1 = *(uint *)&(this->super_FactoredDecPOMDPDiscrete).field_0x708;
      uVar9 = (ulong)uVar1;
      if (uVar1 - 1 < 3) {
        if ((~*(ulong *)&(this->super_FactoredDecPOMDPDiscrete).field_0x710 & 0x7fffffffffffffff) !=
            0) {
          uVar9 = 0;
          do {
            splitState(this,(Index)uVar9,&bI,&newPacket);
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8[0]._M_local_buf,"bl",2);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            pcVar11 = "newP";
            if (newPacket == 0) {
              pcVar11 = "none";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8[0]._M_local_buf,pcVar11,4);
            std::__cxx11::stringbuf::str();
            MADPComponentFactoredStates::AddStateFactorValue(this_00,IVar6,(string *)&ySc);
            if ((pointer *)
                ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                &ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(ySc.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)ySc.super_SDT.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
            std::ios_base::~ios_base(local_138);
            uVar9 = (ulong)((Index)uVar9 + 1);
          } while (*(long *)&(this->super_FactoredDecPOMDPDiscrete).field_0x710 * 2 + 2U != uVar9);
        }
      }
      else if (uVar1 == 0) {
        do {
          ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&ySc.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct<char_const*>((string *)&ySc,"bl","");
          StringTools::Append((string *)&ss,(string *)&ySc,(int)uVar9);
          MADPComponentFactoredStates::AddStateFactorValue(this_00,IVar6,(string *)&ss);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_ss != local_1a8) {
            operator_delete(_ss,local_1a8[0]._M_allocated_capacity + 1);
          }
          if ((pointer *)
              ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage) {
            operator_delete(ySc.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)ySc.super_SDT.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (uVar9 <= *(ulong *)&(this->super_FactoredDecPOMDPDiscrete).field_0x710);
      }
      uVar9 = CONCAT44(0,local_258._0_4_ + 1);
      local_258._0_8_ = uVar9;
    } while (uVar9 < this->_m_nrIslands);
  }
  MADPComponentFactoredStates::SetInitialized
            (&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates._m_S,true);
  this_01 = (FSDist_COF *)operator_new(0x48);
  FSDist_COF::FSDist_COF
            (this_01,(MultiAgentDecisionProcessDiscreteFactoredStatesInterface *)
                     (&(this->super_FactoredDecPOMDPDiscrete).
                       super_MultiAgentDecisionProcessDiscreteFactoredStates.
                       super_MultiAgentDecisionProcess.field_0x0 +
                     *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                         super_MultiAgentDecisionProcess + -0x48)));
  if (this->_m_nrIslands != 0) {
    uVar9 = 0;
    do {
      IVar6 = *(Index *)&(this->super_FactoredDecPOMDPDiscrete).field_0x708;
      if (IVar6 - 1 < 3) {
        IVar6 = composeState(this,0,0);
LAB_003f17dc:
        FSDist_COF::SetProbability(this_01,(Index)uVar9,IVar6,1.0);
      }
      else if (IVar6 == 0) goto LAB_003f17dc;
      uVar9 = (ulong)((Index)uVar9 + 1);
    } while (uVar9 < this->_m_nrIslands);
  }
  (this->super_FactoredDecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscreteFactoredStates._m_S.
  _m_initialStateDistribution = (FactoredStateDistribution *)this_01;
  ConstructActions(this);
  MADPComponentDiscreteActions::SetInitialized
            (&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates._m_A,true);
  ConstructObservations(this);
  MADPComponentDiscreteObservations::SetInitialized
            (&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates._m_O,true);
  (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                         super_MultiAgentDecisionProcessDiscreteFactoredStates.
                         super_MultiAgentDecisionProcess + 0x240))(this);
  (this->super_FactoredDecPOMDPDiscrete)._m_nrLRFs = this->_m_nrIslands;
  FactoredDecPOMDPDiscrete::InitializeStorage(&this->super_FactoredDecPOMDPDiscrete);
  if (this->_m_nrIslands != 0) {
    uVar9 = 0;
    do {
      _ss = (pointer)0x0;
      local_1a8[0]._M_allocated_capacity = 0;
      ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      IVar6 = (Index)uVar9;
      bI = IVar6;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&ySc,(iterator)0x0,(uint *)&bI
                );
      _bI = (pointer)0x0;
      puStack_290 = (pointer)0x0;
      local_288._M_allocated_capacity = 0;
      newPacket = IVar6;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&bI,(iterator)0x0,&newPacket);
      FactoredDecPOMDPDiscrete::SetScopeForLRF
                (&this->super_FactoredDecPOMDPDiscrete,IVar6,(Scope *)&ss,(Scope *)&bI,&ySc,
                 (Scope *)&ss);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_bI != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        operator_delete(_bI,local_288._M_allocated_capacity - (long)_bI);
      }
      if (ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(ySc.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)ySc.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)ySc.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_ss != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        operator_delete(_ss,local_1a8[0]._M_allocated_capacity - (long)_ss);
      }
      uVar9 = (ulong)(IVar6 + 1);
    } while (uVar9 < this->_m_nrIslands);
  }
  FactoredDecPOMDPDiscrete::InitializeInstantiationInformation
            (&this->super_FactoredDecPOMDPDiscrete);
  if (this->_m_nrIslands != 0) {
    uVar9 = 0;
    do {
      _bI = (pointer)0x0;
      puStack_290 = (pointer)0x0;
      local_288._M_allocated_capacity = 0;
      local_268._M_allocated_capacity = 0;
      _newPacket = (pointer)0x0;
      puStack_270 = (pointer)0x0;
      IVar6 = (Index)uVar9;
      _ss = IVar6;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&newPacket,(iterator)0x0,
                 (uint *)&ss);
      this_02 = (Scope *)(**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                                super_MultiAgentDecisionProcessDiscreteFactoredStates
                                                .super_MultiAgentDecisionProcess + 0x280))
                                   (this,uVar9);
      this_03 = (Scope *)(**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                                super_MultiAgentDecisionProcessDiscreteFactoredStates
                                                .super_MultiAgentDecisionProcess + 0x288))
                                   (this,uVar9);
      Scope::SoftPrint_abi_cxx11_((string *)&ss,this_02);
      Scope::SoftPrint_abi_cxx11_((string *)&ySc,this_03);
      sVar10 = FactoredDecPOMDPDiscrete::GetNrXIs(&this->super_FactoredDecPOMDPDiscrete,IVar6);
      local_258._0_8_ = sVar10;
      sVar10 = FactoredDecPOMDPDiscrete::GetNrAIs(&this->super_FactoredDecPOMDPDiscrete,IVar6);
      this_04 = (RewardModelMapping *)operator_new(0x80);
      RewardModelMapping::RewardModelMapping
                (this_04,local_258._0_8_,sVar10,(string *)&ss,(string *)&ySc);
      ppRVar3 = (this->super_FactoredDecPOMDPDiscrete)._m_LRFs.
                super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->super_FactoredDecPOMDPDiscrete)._m_LRFs.
                        super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppRVar3 >> 3) <= uVar9) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      ppRVar3[uVar9] = (RewardModel *)this_04;
      uVar9 = 0;
      do {
        emptyVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        emptyVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        emptyVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)operator_new(4);
        yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
        *yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start = 0;
        iVar2 = *(int *)&(this->super_FactoredDecPOMDPDiscrete).field_0x708;
        backlog = (Index)uVar9;
        yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2 - 1U < 3) {
          local_258 = vcvtusi2sd_avx512f(in_XMM2,backlog);
          auVar4._8_8_ = 0x8000000000000000;
          auVar4._0_8_ = 0x8000000000000000;
          auVar12 = vorpd_avx512vl(local_258,auVar4);
          newPacket_00 = 0;
          do {
            IVar7 = composeState(this,backlog,newPacket_00);
            *yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start = IVar7;
            uVar1 = *(uint *)&(this->super_FactoredDecPOMDPDiscrete).field_0x708;
            local_228 = auVar12._0_8_;
            if ((2 < uVar1) && (local_228 = 42.0, uVar1 == 3)) {
              local_228 = exp2((double)local_258._0_8_);
              local_228 = 1.0 - local_228;
            }
            FactoredDecPOMDPDiscrete::SetRewardForLRF
                      (&this->super_FactoredDecPOMDPDiscrete,IVar6,(Scope *)&bI,&emptyVec,
                       (Scope *)&bI,&emptyVec,(Scope *)&newPacket,&yVals,(Scope *)&bI,&emptyVec,
                       local_228);
            newPacket_00 = newPacket_00 + 1;
          } while (newPacket_00 != 2);
        }
        else if (iVar2 == 0) {
          *yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = backlog;
          auVar12 = vcvtusi2sd_avx512f(in_XMM2,backlog);
          auVar5._8_8_ = 0x8000000000000000;
          auVar5._0_8_ = 0x8000000000000000;
          auVar12 = vorpd_avx512vl(auVar12,auVar5);
          FactoredDecPOMDPDiscrete::SetRewardForLRF
                    (&this->super_FactoredDecPOMDPDiscrete,IVar6,(Scope *)&bI,&emptyVec,(Scope *)&bI
                     ,&emptyVec,(Scope *)&newPacket,&yVals,(Scope *)&bI,&emptyVec,auVar12._0_8_);
        }
        if (yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(yVals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)yVals.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)yVals.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (emptyVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(emptyVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)emptyVec.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)emptyVec.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar9 = (ulong)(backlog + 1);
      } while (uVar9 <= *(ulong *)&(this->super_FactoredDecPOMDPDiscrete).field_0x710);
      if ((pointer *)
          ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &ySc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(ySc.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)ySc.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_ss != local_1a8) {
        operator_delete(_ss,local_1a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_newPacket !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(_newPacket,local_268._M_allocated_capacity - (long)_newPacket);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_bI != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        operator_delete(_bI,local_288._M_allocated_capacity - (long)_bI);
      }
      uVar9 = (ulong)(IVar6 + 1);
    } while (uVar9 < this->_m_nrIslands);
  }
  MultiAgentDecisionProcessDiscreteFactoredStates::SetInitialized
            ((MultiAgentDecisionProcessDiscreteFactoredStates *)this,true);
  if (nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProblemAloha::InitializeAloha()
{
    SetSparse(true);

    /* -----------'ConstructNrAgents()' ------- */
    switch(_m_islandConf)
    {
    case OneIsland:
        _m_nrIslands=1;
        break;
    case TwoIslands:
    case TwoIndependentIslands:
        _m_nrIslands=2;
        break;
    case ThreeIslandsInLine:
    case ThreeIslandsClustered:
    case SmallBigSmallInLine:
        _m_nrIslands=3;
        break;
    case FourIslandsInLine:
    case FourIslandsInSquare:
        _m_nrIslands=4;
        break;
    case FiveIslandsInLine:
        _m_nrIslands=5;
        break;
    case SixIslandsInLine:
        _m_nrIslands=6;
        break;
    case SevenIslandsInLine:
        _m_nrIslands=7;
        break;
    case InLine:
        _m_nrIslands=_m_nrAgentsPassedOnCommandline;
        break;
    default:
        throw(E("InitializeAloha() island config not handled"));
    }
    SetNrAgents(_m_nrIslands);

    // first we need to set the number of agents before the
    // SoftPrintBriefDescription() is correct
    SetName(SoftPrintBriefDescription());
    SetDescription(SoftPrintDescription());
    SetUnixName(SoftPrintBriefDescription());

    vector<size_t> nrElems(2);
    nrElems[0]=_m_maxBacklog;
    nrElems[1]=2; // yes or no
    _m_stepSizeState=IndexTools::CalculateStepSize(nrElems);
    nrElems[0]=3;
    nrElems[1]=2; // yes or no
    _m_stepSizeObservations=IndexTools::CalculateStepSize(nrElems);

    /* 
     * -----------'ConstructStateSpace() -------
     */
    for(Index iI = 0; iI < _m_nrIslands; iI++)
    {
        Index sfI = AddStateFactor( 
                StringTools::Append("BL",iI) , 
                StringTools::Append("The back log of island ",iI));

        switch(_m_variation)
        {
        case NewPacket:
        case NewPacketSendAll:
        case NewPacketProgressivePenalty:
        {
            for(Index sI=0;sI!=(_m_maxBacklog+1)*2;++sI)
            {
                Index bI,newPacket;
                splitState(sI,bI,newPacket);
                stringstream ss;
                ss << "bl" << bI;
                if(newPacket)
                    ss << "newP";
                else
                    ss << "none";
                
                AddStateFactorValue(sfI, ss.str());
            }
            break;
        }
        case NoNewPacket:
        {
            for(Index bI=0; bI <= _m_maxBacklog; bI++)
                AddStateFactorValue(sfI,
                                    StringTools::Append("bl",bI));
            break;
        }
        }
    }

    SetStatesInitialized(true);


    /*-----------'ConstructInitialStateDistribution' ------- */
    //after initialization we can add the ISD:
    FSDist_COF *isd=
        new FSDist_COF(*this);
    for(Index iI = 0; iI < _m_nrIslands; iI++)
    {
        switch(_m_variation)
        {
        case NewPacket:
        case NewPacketSendAll:
        case NewPacketProgressivePenalty:
            // each island starts with backlog 0 and no new packet
            isd->SetProbability(iI,composeState(0,0),1.0); 
            break;
        case NoNewPacket:
            isd->SetProbability(iI,0,1.0); // each island starts with backlog 0
            break;
        }
    }
    SetISD(isd);

// add actions:
    ConstructActions();
#if 0 // for factored models we typically don't want to use joint indices
    ConstructJointActions();
#endif
    SetActionsInitialized(true);

// add observations:
    ConstructObservations();
#if 0 // for factored models we typically don't want to use joint indices
    ConstructJointObservations();
#endif
    SetObservationsInitialized(true);

    // Initialize the 2DBN in MultiAgentDecisionProcessDiscreteFactoredStates
    Initialize2DBN();

//    cout << ">>>Trans./obs. models created"<<endl;
//    cout << _m_2dbn.SoftPrint();


//add rewards
    SetNrLRFs(_m_nrIslands);
    //first add scope for each reward function
    for(Index e=0; e < _m_nrIslands; e++)
    {
        //cout << "Setting scope for reward function e=" << e << endl;
        //Add scope
        Scope emptySc;
        Scope ySc;
        ySc.Insert(e);//reward e depends on backlog of island e
        Scope aSc;
        aSc.Insert(e); // this seems necessary...
        SetScopeForLRF(e, emptySc, aSc, ySc, emptySc);
        //const Scope& agSC = GetAgentScopeForLRF(e);
        //cout << "agent scope = " << agSC.SoftPrint();
    }
    // compute some bookkeeping from the scopes
    InitializeInstantiationInformation();

    // now we add the reward functions themselves
    for(Index e=0; e < _m_nrIslands; e++)
    {
        //cout << "Adding reward function e=" << e << endl;
        Scope emptySc;
        Scope ySc;
        ySc.Insert(e);//reward e depends on backlog of island e
        const Scope& sfSC = GetStateFactorScopeForLRF(e);
        const Scope& agSC = GetAgentScopeForLRF(e);
        string sf_descr = sfSC.SoftPrint();
        string ag_descr = agSC.SoftPrint();
        //the number of X instantiations (the size of the 'local' state space)
        size_t nrXIs = GetNrXIs(e);
        size_t nrAIs = GetNrAIs(e);
#if 0
        cout << "nrXIs " << nrXIs << " nrAIs " << nrAIs << " agSC " << agSC
             << " sfSC " << sfSC << endl;
#endif
        RewardModelMapping* RMe = 
            new RewardModelMapping(nrXIs, nrAIs, sf_descr, ag_descr);
        SetRM(e, RMe);
        
        for(Index bI=0; bI <= _m_maxBacklog; bI++)
        {
            vector<Index> emptyVec;
            vector<Index> yVals(1);
            
            switch(_m_variation)
            {
            case NewPacket:
            case NewPacketSendAll:
            case NewPacketProgressivePenalty:
            {
                for(Index j=0;j!=2;++j)
                {
                    yVals[0]=composeState(bI,j);
                    SetRewardForLRF(  e,
                                      emptySc, emptyVec, //X scope + value
                                      emptySc, emptyVec, //A scope + value
                                      ySc, yVals,        //Y scope + value
                                      emptySc, emptyVec, //O scope + value
                                      backlogToReward(bI) //the reward
                        );
                }
                break;
            }
            case NoNewPacket:
            {
                yVals[0]=bI;
                SetRewardForLRF(  e,
                                  emptySc, emptyVec, //X scope + value
                                  emptySc, emptyVec, //A scope + value
                                  ySc, yVals,        //Y scope + value
                                  emptySc, emptyVec, //O scope + value
                                  backlogToReward(bI) //the reward
                    );
                break;
            }
            }
        }
    }

    FactoredDecPOMDPDiscrete::SetInitialized(true);
}